

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int balance_quick(MemPage *pParent,MemPage *pPage,u8 *pSpace)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  u8 *puVar4;
  undefined1 local_c8 [8];
  CellArray b;
  u8 *pStop;
  byte *pbStack_50;
  u16 szCell;
  u8 *pCell;
  u8 *pOut;
  Pgno pgnoNew;
  int rc;
  MemPage *pNew;
  BtShared *pBt;
  u8 *pSpace_local;
  MemPage *pPage_local;
  MemPage *pParent_local;
  
  pNew = (MemPage *)pPage->pBt;
  pBt = (BtShared *)pSpace;
  pSpace_local = &pPage->isInit;
  pPage_local = pParent;
  if (pPage->nCell == 0) {
    pParent_local._4_4_ = sqlite3CorruptError(0x11355);
  }
  else {
    pOut._4_4_ = allocateBtreePage((BtShared *)pNew,(MemPage **)&pgnoNew,(Pgno *)&pOut,0,'\0');
    if (pOut._4_4_ == 0) {
      pCell = (u8 *)((long)&pBt->pPager + 4);
      pbStack_50 = *(byte **)(pSpace_local + 0x28);
      pStop._6_2_ = (**(code **)(pSpace_local + 0x78))(pSpace_local,pbStack_50);
      zeroPage(_pgnoNew,0xd);
      local_c8._0_4_ = 1;
      b._0_8_ = pSpace_local;
      b.pRef = (MemPage *)&stack0xffffffffffffffb0;
      b.apCell = (u8 **)((long)&pStop + 6);
      b.szCell = *(u16 **)(pSpace_local + 0x58);
      b.apEnd[5]._0_4_ = 2;
      pOut._4_4_ = rebuildPage((CellArray *)local_c8,0,1,_pgnoNew);
      if (pOut._4_4_ != 0) {
        releasePage(_pgnoNew);
        return pOut._4_4_;
      }
      _pgnoNew->nFree =
           ((*(int *)((long)pNew->apOvfl + 0xc) - (uint)_pgnoNew->cellOffset) + -2) -
           (uint)pStop._6_2_;
      if ((*(char *)((long)pNew->aiOvfl + 5) != '\0') &&
         (ptrmapPut((BtShared *)pNew,(Pgno)pOut,'\x05',pPage_local->pgno,(int *)((long)&pOut + 4)),
         _pgnoNew->minLocal < pStop._6_2_)) {
        ptrmapPutOvflPtr(_pgnoNew,_pgnoNew,pbStack_50,(int *)((long)&pOut + 4));
      }
      pbVar2 = (byte *)(*(long *)(pSpace_local + 0x50) +
                       (long)(int)(uint)(*(ushort *)(pSpace_local + 0x1a) &
                                        CONCAT11(*(undefined1 *)
                                                  (*(long *)(pSpace_local + 0x60) +
                                                  (long)(int)((*(ushort *)(pSpace_local + 0x18) - 1)
                                                             * 2)),
                                                 *(undefined1 *)
                                                  (*(long *)(pSpace_local + 0x60) + 1 +
                                                  (long)(int)((*(ushort *)(pSpace_local + 0x18) - 1)
                                                             * 2)))));
      pbVar3 = pbVar2;
      do {
        pbStack_50 = pbVar3;
        pbVar3 = pbStack_50 + 1;
      } while ((*pbStack_50 & 0x80) != 0 && pbVar3 < pbVar2 + 9);
      b.ixNx._16_8_ = pbStack_50 + 10;
      pbStack_50 = pbVar3;
      do {
        pbVar3 = pbStack_50 + 1;
        bVar1 = *pbStack_50;
        puVar4 = pCell + 1;
        *pCell = bVar1;
        pbStack_50 = pbVar3;
        pCell = puVar4;
      } while ((bVar1 & 0x80) != 0 && pbVar3 < (ulong)b.ixNx._16_8_);
      if (pOut._4_4_ == 0) {
        insertCell(pPage_local,(uint)pPage_local->nCell,(u8 *)pBt,(int)puVar4 - (int)pBt,(u8 *)0x0,
                   *(Pgno *)(pSpace_local + 4),(int *)((long)&pOut + 4));
      }
      sqlite3Put4byte(pPage_local->aData + (int)(pPage_local->hdrOffset + 8),(Pgno)pOut);
      releasePage(_pgnoNew);
    }
    pParent_local._4_4_ = pOut._4_4_;
  }
  return pParent_local._4_4_;
}

Assistant:

static int balance_quick(MemPage *pParent, MemPage *pPage, u8 *pSpace){
  BtShared *const pBt = pPage->pBt;    /* B-Tree Database */
  MemPage *pNew;                       /* Newly allocated page */
  int rc;                              /* Return Code */
  Pgno pgnoNew;                        /* Page number of pNew */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pParent->pDbPage) );
  assert( pPage->nOverflow==1 );
  
  if( pPage->nCell==0 ) return SQLITE_CORRUPT_BKPT;  /* dbfuzz001.test */
  assert( pPage->nFree>=0 );
  assert( pParent->nFree>=0 );

  /* Allocate a new page. This page will become the right-sibling of 
  ** pPage. Make the parent page writable, so that the new divider cell
  ** may be inserted. If both these operations are successful, proceed.
  */
  rc = allocateBtreePage(pBt, &pNew, &pgnoNew, 0, 0);

  if( rc==SQLITE_OK ){

    u8 *pOut = &pSpace[4];
    u8 *pCell = pPage->apOvfl[0];
    u16 szCell = pPage->xCellSize(pPage, pCell);
    u8 *pStop;
    CellArray b;

    assert( sqlite3PagerIswriteable(pNew->pDbPage) );
    assert( CORRUPT_DB || pPage->aData[0]==(PTF_INTKEY|PTF_LEAFDATA|PTF_LEAF) );
    zeroPage(pNew, PTF_INTKEY|PTF_LEAFDATA|PTF_LEAF);
    b.nCell = 1;
    b.pRef = pPage;
    b.apCell = &pCell;
    b.szCell = &szCell;
    b.apEnd[0] = pPage->aDataEnd;
    b.ixNx[0] = 2;
    rc = rebuildPage(&b, 0, 1, pNew);
    if( NEVER(rc) ){
      releasePage(pNew);
      return rc;
    }
    pNew->nFree = pBt->usableSize - pNew->cellOffset - 2 - szCell;

    /* If this is an auto-vacuum database, update the pointer map
    ** with entries for the new page, and any pointer from the 
    ** cell on the page to an overflow page. If either of these
    ** operations fails, the return code is set, but the contents
    ** of the parent page are still manipulated by thh code below.
    ** That is Ok, at this point the parent page is guaranteed to
    ** be marked as dirty. Returning an error code will cause a
    ** rollback, undoing any changes made to the parent page.
    */
    if( ISAUTOVACUUM ){
      ptrmapPut(pBt, pgnoNew, PTRMAP_BTREE, pParent->pgno, &rc);
      if( szCell>pNew->minLocal ){
        ptrmapPutOvflPtr(pNew, pNew, pCell, &rc);
      }
    }
  
    /* Create a divider cell to insert into pParent. The divider cell
    ** consists of a 4-byte page number (the page number of pPage) and
    ** a variable length key value (which must be the same value as the
    ** largest key on pPage).
    **
    ** To find the largest key value on pPage, first find the right-most 
    ** cell on pPage. The first two fields of this cell are the 
    ** record-length (a variable length integer at most 32-bits in size)
    ** and the key value (a variable length integer, may have any value).
    ** The first of the while(...) loops below skips over the record-length
    ** field. The second while(...) loop copies the key value from the
    ** cell on pPage into the pSpace buffer.
    */
    pCell = findCell(pPage, pPage->nCell-1);
    pStop = &pCell[9];
    while( (*(pCell++)&0x80) && pCell<pStop );
    pStop = &pCell[9];
    while( ((*(pOut++) = *(pCell++))&0x80) && pCell<pStop );

    /* Insert the new divider cell into pParent. */
    if( rc==SQLITE_OK ){
      insertCell(pParent, pParent->nCell, pSpace, (int)(pOut-pSpace),
                   0, pPage->pgno, &rc);
    }

    /* Set the right-child pointer of pParent to point to the new page. */
    put4byte(&pParent->aData[pParent->hdrOffset+8], pgnoNew);
  
    /* Release the reference to the new page. */
    releasePage(pNew);
  }

  return rc;
}